

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  bool bVar1;
  pointer this_00;
  ExpectationBase *pEVar2;
  reference an_expectation_base;
  linked_ptr<testing::internal::ExpectationBase> *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal lVar3;
  Expectation EVar4;
  allocator local_59;
  string local_58;
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
  local_38;
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
  local_30;
  __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
  local_28;
  const_iterator it;
  ExpectationBase *exp_local;
  UntypedFunctionMockerBase *this_local;
  
  it._M_current = in_RDX;
  local_30._M_current =
       (linked_ptr<testing::internal::ExpectationBase> *)
       std::
       vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
       ::begin((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                *)((long)&(exp->source_text_).field_2 + 8));
  __gnu_cxx::
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>const*,std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>>>>
  ::__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>*>
            ((__normal_iterator<testing::internal::linked_ptr<testing::internal::ExpectationBase>const*,std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>>>>
              *)&local_28,&local_30);
  do {
    local_38._M_current =
         (linked_ptr<testing::internal::ExpectationBase> *)
         std::
         vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
         ::end((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                *)((long)&(exp->source_text_).field_2 + 8));
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"Cannot find expectation.",&local_59);
      Assert(false,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/paulelsner[P]gurkenlaeufer/gtest/src/gmock-gtest-all.cpp"
             ,0x2dc7,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      Expectation::Expectation((Expectation *)this);
      lVar3.next_ = extraout_RDX_00;
LAB_002337e3:
      EVar4.expectation_base_.link_.next_ = lVar3.next_;
      EVar4.expectation_base_.value_ = (ExpectationBase *)this;
      return (Expectation)EVar4.expectation_base_;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
              ::operator->(&local_28);
    pEVar2 = linked_ptr<testing::internal::ExpectationBase>::get(this_00);
    if (pEVar2 == (ExpectationBase *)it._M_current) {
      an_expectation_base =
           __gnu_cxx::
           __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
           ::operator*(&local_28);
      Expectation::Expectation((Expectation *)this,an_expectation_base);
      lVar3.next_ = extraout_RDX;
      goto LAB_002337e3;
    }
    __gnu_cxx::
    __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}